

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_escape_sequence_abi_cxx11_
          (result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  undefined1 *puVar1;
  byte bVar2;
  const_iterator rollback;
  value_type *pvVar3;
  location *loc_00;
  location *loc_01;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *ctx;
  result<toml::detail::region,_toml::detail::none_t> *this_00;
  string *this_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  allocator_type local_1cb;
  allocator<char> local_1ca;
  allocator_type local_1c9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  result<toml::detail::region,_toml::detail::none_t> token;
  string local_158;
  undefined1 local_138 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  char local_e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  string msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  rollback._M_current = *(char **)(this + 0x40);
  if ((rollback._M_current == *(char **)(*(long *)(this + 8) + 8)) || (*rollback._M_current != '\\')
     ) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,"toml::parse_escape_sequence: ",(allocator<char> *)&local_38);
    source_location::source_location((source_location *)&token,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[38],_true>
              ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_f8,(source_location *)&token,
               (char (*) [38])"the next token is not a backslash \"\\\"");
    __l._M_len = 1;
    __l._M_array = (iterator)&local_f8;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_158,__l,&local_1cb);
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    format_underline((string *)&local_118,(string *)local_138,
                     (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_158,&local_1c8,false);
    msg._M_dataplus._M_p = (pointer)&msg.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity == &local_108) {
      msg.field_2._8_8_ = local_108._8_8_;
    }
    else {
      msg._M_dataplus._M_p = (pointer)local_118._M_allocated_capacity;
    }
    msg._M_string_length = local_118._8_8_;
    local_118._8_8_ = 0;
    local_108._M_allocated_capacity = local_108._M_allocated_capacity & 0xffffffffffffff00;
    local_118._M_allocated_capacity = (size_type)&local_108;
    result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,(failure_type *)&msg);
    std::__cxx11::string::~string((string *)&msg);
    std::__cxx11::string::~string((string *)local_118._M_local_buf);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c8);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_158);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_f8);
    source_location::~source_location((source_location *)&token);
    this_00 = (result<toml::detail::region,_toml::detail::none_t> *)local_138;
    goto LAB_001284c8;
  }
  location::advance((location *)this,1);
  bVar2 = **(byte **)(this + 0x40);
  loc_00 = (location *)(ulong)(bVar2 - 0x6e);
  if (bVar2 - 0x6e < 8) {
    loc_01 = (location *)
             ((long)&switchD_00128244::switchdataD_001832e4 +
             (long)(int)(&switchD_00128244::switchdataD_001832e4)[(long)loc_00]);
    switch(loc_00) {
    case (location *)0x0:
      location::advance((location *)this,1);
      __s = "\n";
      break;
    default:
switchD_00128244_caseD_6f:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_118._M_local_buf,
                 "parse_escape_sequence: unknown escape sequence appeared.",
                 (allocator<char> *)&local_38);
      source_location::source_location((source_location *)&token,(location *)this);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[64],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,(source_location *)&token,
                 (char (*) [64])"escape sequence is one of \\, \", b, t, n, f, r, uxxxx, Uxxxxxxxx")
      ;
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_f8;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_158,__l_00,&local_1cb);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_138,
                 "if you want to write backslash as just one backslash, use literal string like: regex    = \'<\\i\\c*\\s*>\'"
                 ,&local_1ca);
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)local_138;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1c8,__l_01,&local_1c9);
      format_underline(&msg,(string *)&local_118,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_158,&local_1c8,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1c8);
      std::__cxx11::string::~string((string *)local_138);
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_158);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_f8);
      source_location::~source_location((source_location *)&token);
      std::__cxx11::string::~string((string *)local_118._M_local_buf);
      location::reset((location *)this,rollback);
      std::__cxx11::string::string((string *)local_f8._M_local_buf,(string *)&msg);
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,(failure_type *)&local_f8);
      std::__cxx11::string::~string((string *)local_f8._M_local_buf);
      this_00 = (result<toml::detail::region,_toml::detail::none_t> *)&msg;
      goto LAB_001284c8;
    case (location *)0x4:
      location::advance((location *)this,1);
      __s = "\r";
      break;
    case (location *)0x6:
      location::advance((location *)this,1);
      __s = "\t";
      break;
    case (location *)0x7:
      sequence<toml::detail::character<'u'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'9'>,_toml::detail::in_range<'A',_'F'>,_toml::detail::in_range<'a',_'f'>_>,_toml::detail::exactly<4UL>_>_>
      ::invoke(&token,(location *)this);
      if (token.is_ok_ != true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,
                   "parse_escape_sequence: invalid token found in UTF-8 codepoint uXXXX.",
                   (allocator<char> *)&local_1cb);
        source_location::source_location((source_location *)&msg,(location *)this);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[5],_true>
                  ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f8,(source_location *)&msg,(char (*) [5])0x18793d);
        __l_02._M_len = 1;
        __l_02._M_array = (iterator)&local_f8;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_1c8,__l_02,(allocator_type *)&local_1ca);
        local_38.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_38.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_38.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        format_underline((string *)local_138,&local_158,
                         (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_1c8,&local_38,false);
LAB_00128675:
        local_118._M_allocated_capacity = (size_type)&local_108;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_138 + 0x10)) {
          local_108._8_8_ = local_138._24_8_;
        }
        else {
          local_118._M_allocated_capacity = local_138._0_8_;
        }
        local_118._8_8_ = local_138._8_8_;
        local_138._8_8_ = (_func_int **)0x0;
        local_138[0x10] = '\0';
        ctx = &local_118;
        local_138._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_138 + 0x10);
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::result(__return_storage_ptr__,(failure_type *)&local_118);
        std::__cxx11::string::~string((string *)local_118._M_local_buf);
        std::__cxx11::string::~string((string *)local_138);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_38);
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_1c8);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_f8);
        source_location::~source_location((source_location *)&msg);
        this_01 = &local_158;
        goto LAB_0012876e;
      }
      pvVar3 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&token);
      read_utf8_codepoint_abi_cxx11_(&msg,(detail *)pvVar3,(region *)this,loc_01);
LAB_00128514:
      local_f8._M_allocated_capacity = (size_type)local_e8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p == &msg.field_2) {
        _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)msg.field_2._8_8_;
      }
      else {
        local_f8._M_allocated_capacity = (size_type)msg._M_dataplus._M_p;
      }
      this_01 = &msg;
      local_f8._8_8_ = msg._M_string_length;
      msg._M_string_length = 0;
      msg.field_2._M_allocated_capacity = msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
      ctx = &local_f8;
      msg._M_dataplus._M_p = (pointer)&msg.field_2;
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,(success_type *)&local_f8);
      std::__cxx11::string::~string((string *)local_f8._M_local_buf);
LAB_0012876e:
      std::__cxx11::string::~string((string *)this_01);
      result<toml::detail::region,_toml::detail::none_t>::cleanup
                (&token,(EVP_PKEY_CTX *)ctx->_M_local_buf);
      return __return_storage_ptr__;
    }
  }
  else if (bVar2 == 0x22) {
    location::advance((location *)this,1);
    __s = "\"";
  }
  else {
    if (bVar2 == 0x55) {
      sequence<toml::detail::character<'U'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'9'>,_toml::detail::in_range<'A',_'F'>,_toml::detail::in_range<'a',_'f'>_>,_toml::detail::exactly<8UL>_>_>
      ::invoke(&token,(location *)this);
      if (token.is_ok_ != true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,
                   "parse_escape_sequence: invalid token found in UTF-8 codepoint Uxxxxxxxx",
                   (allocator<char> *)&local_1cb);
        source_location::source_location((source_location *)&msg,(location *)this);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[5],_true>
                  ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f8,(source_location *)&msg,(char (*) [5])0x18793d);
        __l_03._M_len = 1;
        __l_03._M_array = (iterator)&local_f8;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_1c8,__l_03,(allocator_type *)&local_1ca);
        local_38.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_38.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_38.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        format_underline((string *)local_138,&local_158,
                         (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_1c8,&local_38,false);
        goto LAB_00128675;
      }
      pvVar3 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&token);
      read_utf8_codepoint_abi_cxx11_(&msg,(detail *)pvVar3,(region *)this,loc_00);
      goto LAB_00128514;
    }
    if (bVar2 == 0x66) {
      location::advance((location *)this,1);
      __s = "\f";
    }
    else if (bVar2 == 0x62) {
      location::advance((location *)this,1);
      __s = "\b";
    }
    else {
      if (bVar2 != 0x5c) goto switchD_00128244_caseD_6f;
      location::advance((location *)this,1);
      __s = "\\";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&token,__s,(allocator<char> *)&msg);
  local_f8._M_allocated_capacity = (size_type)local_e8;
  puVar1 = (undefined1 *)((long)&token.field_1 + 8);
  if ((undefined1 *)token._0_8_ == puVar1) {
    _Stack_e0._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         token.field_1.succ.value.source_.
         super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
  }
  else {
    local_f8._M_allocated_capacity = token._0_8_;
  }
  this_00 = &token;
  local_f8._8_8_ = token.field_1.succ.value.super_region_base._vptr_region_base;
  token.field_1.succ.value.super_region_base._vptr_region_base = (region_base)(_func_int **)0x0;
  token.field_1._8_1_ = 0;
  token._0_8_ = puVar1;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::result(__return_storage_ptr__,(success_type *)&local_f8);
  std::__cxx11::string::~string((string *)local_f8._M_local_buf);
LAB_001284c8:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

inline result<std::string, std::string> parse_escape_sequence(location& loc)
{
    const auto first = loc.iter();
    if(first == loc.end() || *first != '\\')
    {
        return err(format_underline("toml::parse_escape_sequence: ", {{
            source_location(loc), "the next token is not a backslash \"\\\""}}));
    }
    loc.advance();
    switch(*loc.iter())
    {
        case '\\':{loc.advance(); return ok(std::string("\\"));}
        case '"' :{loc.advance(); return ok(std::string("\""));}
        case 'b' :{loc.advance(); return ok(std::string("\b"));}
        case 't' :{loc.advance(); return ok(std::string("\t"));}
        case 'n' :{loc.advance(); return ok(std::string("\n"));}
        case 'f' :{loc.advance(); return ok(std::string("\f"));}
        case 'r' :{loc.advance(); return ok(std::string("\r"));}
#ifdef TOML11_USE_UNRELEASED_TOML_FEATURES
        case 'e' :{loc.advance(); return ok(std::string("\x1b"));} // ESC
#endif
        case 'u' :
        {
            if(const auto token = lex_escape_unicode_short::invoke(loc))
            {
                return ok(read_utf8_codepoint(token.unwrap(), loc));
            }
            else
            {
                return err(format_underline("parse_escape_sequence: "
                           "invalid token found in UTF-8 codepoint uXXXX.",
                           {{source_location(loc), "here"}}));
            }
        }
        case 'U':
        {
            if(const auto token = lex_escape_unicode_long::invoke(loc))
            {
                return ok(read_utf8_codepoint(token.unwrap(), loc));
            }
            else
            {
                return err(format_underline("parse_escape_sequence: "
                           "invalid token found in UTF-8 codepoint Uxxxxxxxx",
                           {{source_location(loc), "here"}}));
            }
        }
    }

    const auto msg = format_underline("parse_escape_sequence: "
           "unknown escape sequence appeared.", {{source_location(loc),
           "escape sequence is one of \\, \", b, t, n, f, r, uxxxx, Uxxxxxxxx"}},
           /* Hints = */{"if you want to write backslash as just one backslash, "
           "use literal string like: regex    = '<\\i\\c*\\s*>'"});
    loc.reset(first);
    return err(msg);
}